

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTester_0000_0999.cpp
# Opt level: O2

void __thiscall psy::C::ParserTester::case0329(ParserTester *this)

{
  string text;
  Expectation X;
  Expectation *pEVar1;
  undefined1 in_stack_fffffffffffffe38 [48];
  undefined8 in_stack_fffffffffffffe68;
  anon_union_8_2_2d0bec1f_for_MacroTranslations_0 in_stack_fffffffffffffe70;
  anon_union_8_2_2d0bec1f_for_LanguageExtensions_1 in_stack_fffffffffffffe78;
  undefined8 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe88 [104];
  ParseOptions in_stack_fffffffffffffef0;
  Expectation local_c0;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffe48,"int y [ const  * ] ;",
             (allocator<char> *)&stack0xfffffffffffffe47);
  Expectation::Expectation((Expectation *)&stack0xfffffffffffffe88);
  pEVar1 = Expectation::setErrorCnt((Expectation *)&stack0xfffffffffffffe88,1);
  Expectation::Expectation(&local_c0,pEVar1);
  ParseOptions::ParseOptions((ParseOptions *)&stack0xfffffffffffffe68);
  text._M_string_length = in_stack_fffffffffffffe70.BF_all_;
  text._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe68;
  text.field_2._M_allocated_capacity = in_stack_fffffffffffffe78.BF_all_;
  text.field_2._8_8_ = in_stack_fffffffffffffe80;
  X.descriptorsW_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffe68;
  X.numE_ = in_stack_fffffffffffffe38._0_4_;
  X.numW_ = in_stack_fffffffffffffe38._4_4_;
  X.descriptorsE_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffffe38._8_24_;
  X.descriptorsW_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffe38._32_8_;
  X.descriptorsW_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffe38._40_8_;
  X.continueTestDespiteOfErrors_ = (bool)in_stack_fffffffffffffe70._0_1_;
  X.containsAmbiguity_ = (bool)in_stack_fffffffffffffe70._1_1_;
  X._58_6_ = in_stack_fffffffffffffe70._2_6_;
  X.ambiguityText_._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe78.BF_all_;
  X.ambiguityText_._M_string_length = in_stack_fffffffffffffe80;
  X.ambiguityText_.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffffe88._0_16_;
  X.unfinishedParse_ = (bool)in_stack_fffffffffffffe88[0x10];
  X._97_7_ = in_stack_fffffffffffffe88._17_7_;
  X.syntaxKinds_.super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl
  .super__Vector_impl_data =
       (_Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>)
       (_Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>)
       in_stack_fffffffffffffe88._24_24_;
  X.declarations_.super__Vector_base<psy::C::Decl,_std::allocator<psy::C::Decl>_>._M_impl.
  super__Vector_impl_data =
       (_Vector_base<psy::C::Decl,_std::allocator<psy::C::Decl>_>)
       (_Vector_base<psy::C::Decl,_std::allocator<psy::C::Decl>_>)in_stack_fffffffffffffe88._48_24_;
  X.checkScope_ = (bool)in_stack_fffffffffffffe88[0x48];
  X._153_7_ = in_stack_fffffffffffffe88._73_7_;
  X.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data =
       (_Vector_base<int,_std::allocator<int>_>)
       (_Vector_base<int,_std::allocator<int>_>)in_stack_fffffffffffffe88._80_24_;
  parse(this,text,X,(SyntaxCategory)&stack0xfffffffffffffe48,in_stack_fffffffffffffef0);
  Expectation::~Expectation(&local_c0);
  Expectation::~Expectation((Expectation *)&stack0xfffffffffffffe88);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe48);
  return;
}

Assistant:

void ParserTester::case0329()
{
    parse("int y [ const  * ] ;",
          Expectation().setErrorCnt(1));
}